

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:221:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:221:17)>
            *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  req;
  undefined1 local_d0 [48];
  undefined1 local_a0 [48];
  Own<capnp::ResponseHook,_std::nullptr_t> local_70;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  local_60;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::loopbackRequest
            (&local_60,&((this->f).env)->membraned,&local_28);
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
            ((kj *)local_d0,(char (*) [8])0x42a834);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
            ((Client *)local_a0,
             (Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)local_d0);
  capnproto_test::capnp::test::TestMembrane::LoopbackParams::Builder::setThing
            (&local_60.super_Builder,(Client *)local_a0);
  Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_a0 + 8));
  Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)local_d0);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
          *)local_d0,(int)&local_60,__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
              *)local_a0,local_d0);
  capnproto_test::capnp::test::TestMembrane::LoopbackResults::Reader::getThing
            (__return_storage_ptr__,(Reader *)local_a0);
  Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_70);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::LoopbackResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::LoopbackResults> *)local_d0);
  Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_60.hook);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }